

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc_analyzer.cc
# Opt level: O0

void __thiscall sptk::reaper::LpcAnalyzer::GetWindow(LpcAnalyzer *this,int n)

{
  size_type sVar1;
  reference pvVar2;
  int in_ESI;
  vector<float,_std::allocator<float>_> *in_RDI;
  double dVar3;
  int i;
  double half;
  double arg;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar4;
  double dVar5;
  double dVar6;
  
  sVar1 = std::vector<float,_std::allocator<float>_>::size(in_RDI);
  if (sVar1 != (long)in_ESI) {
    dVar5 = 0.5;
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)0x3fe0000000000000,
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    for (iVar4 = 0; iVar4 < in_ESI; iVar4 = iVar4 + 1) {
      dVar6 = dVar5;
      dVar3 = cos((dVar5 + (double)iVar4) * (6.283185307179586 / (double)in_ESI));
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](in_RDI,(long)iVar4);
      *pvVar2 = (float)(-dVar5 * dVar3 + dVar5);
      dVar5 = dVar6;
    }
  }
  return;
}

Assistant:

void LpcAnalyzer::GetWindow(int n) {
  //  Need to create a new Hanning window?
  if (energywind_.size() != static_cast<size_t>(n)) {
    double arg = M_PI * 2.0 / n, half = 0.5;
    energywind_.resize(n);
    for (int i = 0; i < n; ++i)
      energywind_[i] = (half - half * cos((half + i) * arg));
  }
}